

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalysis.cpp
# Opt level: O0

void __thiscall TPZAnalysis::Run(TPZAnalysis *this,ostream *out)

{
  long *in_RDI;
  TPZSimpleTimer t_1;
  TPZSimpleTimer t;
  int64_t neq;
  TPZSimpleTimer *in_stack_000001b0;
  string *in_stack_fffffffffffffec8;
  TPZSimpleTimer *in_stack_fffffffffffffed0;
  TPZCompMesh *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  allocator<char> local_99;
  string local_98 [128];
  int64_t local_18;
  
  local_18 = TPZCompMesh::NEquations(in_stack_fffffffffffffee0);
  if (20000 < local_18) {
    std::operator<<((ostream *)&std::cout,"Entering Assemble Equations\n");
    std::ostream::flush();
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             (allocator<char> *)in_stack_fffffffffffffee0);
  TPZSimpleTimer::TPZSimpleTimer
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,SUB81((ulong)in_RDI >> 0x38,0));
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_99);
  (**(code **)(*in_RDI + 0x48))();
  TPZSimpleTimer::~TPZSimpleTimer(in_stack_000001b0);
  if (20000 < local_18) {
    std::operator<<((ostream *)&std::cout,"Entering Solve\n");
    std::ostream::flush();
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             (allocator<char> *)in_stack_fffffffffffffee0);
  TPZSimpleTimer::TPZSimpleTimer
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,SUB81((ulong)in_RDI >> 0x38,0));
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffed0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffecf);
  (**(code **)(*in_RDI + 0x50))();
  TPZSimpleTimer::~TPZSimpleTimer(in_stack_000001b0);
  return;
}

Assistant:

void TPZAnalysis::Run(std::ostream &out)
{
    int64_t neq = fCompMesh->NEquations();
    
    if(neq > 20000)
    {
        std::cout << "Entering Assemble Equations\n";
        std::cout.flush();
    }

    {
        TPZSimpleTimer t("Time for assembly");
        Assemble();
    }
    
    if(neq > 20000)
    {
        std::cout << "Entering Solve\n";
        std::cout.flush();
    }
    
    {
        TPZSimpleTimer t("Time for solving");
        Solve();
    }
}